

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-run-nowait.c
# Opt level: O2

int run_test_run_nowait(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  uVar2 = uv_default_loop();
  uv_timer_init(uVar2,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100);
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,2);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-run-nowait.c"
            ,0x29,"r");
    abort();
  }
  eval_a = (int64_t)timer_called;
  eval_b = 0;
  if (eval_a == 0) {
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    eval_a = 0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    eval_b = (int64_t)iVar1;
    if (eval_b == 0) {
      uv_library_shutdown();
      return 0;
    }
    pcVar4 = "uv_loop_close(uv_default_loop())";
    pcVar3 = "0";
    uVar2 = 0x2c;
  }
  else {
    pcVar4 = "0";
    pcVar3 = "timer_called";
    uVar2 = 0x2a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-run-nowait.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(run_nowait) {
  int r;
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  r = uv_run(uv_default_loop(), UV_RUN_NOWAIT);
  ASSERT(r);
  ASSERT_OK(timer_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}